

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_unmap_mesh.cpp
# Opt level: O3

Remotes * Omega_h::unmap_owners
                    (Remotes *__return_storage_ptr__,Mesh *old_mesh,Int ent_dim,
                    LOs *new_ents2old_ents,LOs *old_ents2new_ents)

{
  element_type *peVar1;
  int *piVar2;
  void **ppvVar3;
  Library *pLVar4;
  element_type *peVar5;
  void *pvVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  Alloc *pAVar9;
  Alloc *pAVar10;
  Remotes *this;
  long *plVar11;
  element_type *peVar12;
  Library *pLVar13;
  bool bVar14;
  ScopedTimer omega_h_scoped_function_timer;
  Write<int> new_own_ranks;
  Read<int> old_copies2new_owners;
  Write<int> new_ents2new_owners;
  Read<int> old_own_ranks;
  Dist old_copies2old_owners;
  Dist old_owners2old_copies;
  ScopedTimer local_249;
  undefined1 local_248 [32];
  undefined1 local_228 [32];
  LOs local_208;
  LOs local_1f8;
  Write<int> local_1e8;
  Write<int> local_1d8;
  Read<int> local_1c8;
  Read<int> local_1b8;
  element_type *local_1a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1a0;
  Remotes *local_198;
  Read<signed_char> local_190;
  Read<signed_char> local_180;
  Alloc *local_170;
  void *local_168;
  Alloc *local_160;
  void *local_158;
  undefined1 local_150 [24];
  void *pvStack_138;
  undefined1 local_c0 [24];
  void *pvStack_a8;
  
  local_248._0_8_ = local_248 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_248,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_unmap_mesh.cpp"
             ,"");
  plVar11 = (long *)std::__cxx11::string::append(local_248);
  peVar5 = (element_type *)(local_c0 + 0x10);
  peVar12 = (element_type *)(plVar11 + 2);
  if ((element_type *)*plVar11 == peVar12) {
    local_c0._16_8_ = peVar12->library_;
    pvStack_a8 = (void *)plVar11[3];
    local_c0._0_8_ = peVar5;
  }
  else {
    local_c0._16_8_ = peVar12->library_;
    local_c0._0_8_ = (element_type *)*plVar11;
  }
  local_c0._8_8_ = plVar11[1];
  *plVar11 = (long)peVar12;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  peVar12 = (element_type *)(local_228 + 0x10);
  local_228._0_8_ = peVar12;
  local_198 = __return_storage_ptr__;
  std::__cxx11::string::_M_construct((ulong)local_228,'\x02');
  *(undefined2 *)(Library **)local_228._0_8_ = 0x3035;
  pLVar4 = (Library *)((long)(_func_int ***)local_c0._8_8_ + local_228._8_8_);
  pLVar13 = (Library *)0xf;
  if ((element_type *)local_c0._0_8_ != peVar5) {
    pLVar13 = (Library *)local_c0._16_8_;
  }
  if (pLVar13 < pLVar4) {
    pLVar13 = (Library *)0xf;
    if ((element_type *)local_228._0_8_ != peVar12) {
      pLVar13 = (Library *)local_228._16_8_;
    }
    if (pLVar4 <= pLVar13) {
      plVar11 = (long *)std::__cxx11::string::replace((ulong)local_228,0,(char *)0x0,local_c0._0_8_)
      ;
      goto LAB_0040fa37;
    }
  }
  plVar11 = (long *)std::__cxx11::string::_M_append(local_c0,local_228._0_8_);
LAB_0040fa37:
  local_150._0_8_ = local_150 + 0x10;
  peVar1 = (element_type *)(plVar11 + 2);
  if ((element_type *)*plVar11 == peVar1) {
    local_150._16_8_ = peVar1->library_;
    pvStack_138 = (void *)plVar11[3];
  }
  else {
    local_150._16_8_ = peVar1->library_;
    local_150._0_8_ = (element_type *)*plVar11;
  }
  local_150._8_8_ = plVar11[1];
  *plVar11 = (long)peVar1;
  plVar11[1] = 0;
  *(undefined1 *)&peVar1->library_ = 0;
  begin_code("unmap_owners",(char *)local_150._0_8_);
  if ((element_type *)local_150._0_8_ != (element_type *)(local_150 + 0x10)) {
    operator_delete((void *)local_150._0_8_,(ulong)((long)(LO *)local_150._16_8_ + 1));
  }
  if ((element_type *)local_228._0_8_ != peVar12) {
    operator_delete((void *)local_228._0_8_,(ulong)((long)(LO *)local_228._16_8_ + 1));
  }
  if ((element_type *)local_c0._0_8_ != peVar5) {
    operator_delete((void *)local_c0._0_8_,(ulong)((long)(LO *)local_c0._16_8_ + 1));
  }
  if ((Alloc *)local_248._0_8_ != (Alloc *)(local_248 + 0x10)) {
    operator_delete((void *)local_248._0_8_,(ulong)((long)(size_t *)local_248._16_8_ + 1));
  }
  Mesh::ask_dist((Dist *)local_150,old_mesh,ent_dim);
  Dist::invert((Dist *)local_c0,(Dist *)local_150);
  local_160 = (old_ents2new_ents->write_).shared_alloc_.alloc;
  if (((ulong)local_160 & 7) == 0 && local_160 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_160 = (Alloc *)(local_160->size * 8 + 1);
    }
    else {
      local_160->use_count = local_160->use_count + 1;
    }
  }
  local_158 = (old_ents2new_ents->write_).shared_alloc_.direct_ptr;
  Dist::exch<int>((Dist *)local_228,(Read<int> *)local_c0,(Int)&local_160);
  pAVar10 = local_160;
  if (((ulong)local_160 & 7) == 0 && local_160 != (Alloc *)0x0) {
    piVar2 = &local_160->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_160);
      operator_delete(pAVar10,0x48);
    }
  }
  local_1f8.write_.shared_alloc_.alloc = (new_ents2old_ents->write_).shared_alloc_.alloc;
  if (((ulong)local_1f8.write_.shared_alloc_.alloc & 7) == 0 &&
      local_1f8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1f8.write_.shared_alloc_.alloc =
           (Alloc *)((local_1f8.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_1f8.write_.shared_alloc_.alloc)->use_count =
           (local_1f8.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_1f8.write_.shared_alloc_.direct_ptr = (new_ents2old_ents->write_).shared_alloc_.direct_ptr;
  local_1b8.write_.shared_alloc_.alloc = (Alloc *)local_228._0_8_;
  if ((local_228._0_8_ & 7) == 0 && (element_type *)local_228._0_8_ != (element_type *)0x0) {
    if (entering_parallel == '\x01') {
      local_1b8.write_.shared_alloc_.alloc = (Alloc *)((long)*(Library **)local_228._0_8_ * 8 + 1);
    }
    else {
      ppvVar3 = &(((HostRead<int> *)(local_228._0_8_ + 0x28))->read_).write_.shared_alloc_.
                 direct_ptr;
      *(int *)ppvVar3 = *(int *)ppvVar3 + 1;
    }
  }
  local_1b8.write_.shared_alloc_.direct_ptr = (void *)local_228._8_8_;
  unmap<int>((Omega_h *)&local_1a8,&local_1f8,&local_1b8,1);
  pAVar10 = local_1b8.write_.shared_alloc_.alloc;
  if (((ulong)local_1b8.write_.shared_alloc_.alloc & 7) == 0 &&
      (element_type *)local_1b8.write_.shared_alloc_.alloc != (element_type *)0x0) {
    ppvVar3 = &(((HostRead<int> *)&(local_1b8.write_.shared_alloc_.alloc)->ptr)->read_).write_.
               shared_alloc_.direct_ptr;
    *(int *)ppvVar3 = *(int *)ppvVar3 + -1;
    if (*(int *)ppvVar3 == 0) {
      Alloc::~Alloc(pAVar10);
      operator_delete(pAVar10,0x48);
    }
  }
  pAVar10 = local_1f8.write_.shared_alloc_.alloc;
  if (((ulong)local_1f8.write_.shared_alloc_.alloc & 7) == 0 &&
      local_1f8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar2 = &(local_1f8.write_.shared_alloc_.alloc)->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_1f8.write_.shared_alloc_.alloc);
      operator_delete(pAVar10,0x48);
    }
  }
  Mesh::ask_owners((Remotes *)local_248,old_mesh,ent_dim);
  uVar8 = local_248._8_8_;
  local_170 = (Alloc *)local_248._0_8_;
  local_168 = (void *)local_248._8_8_;
  if (((local_248._0_8_ & 7) == 0 && (Alloc *)local_248._0_8_ != (Alloc *)0x0) &&
     (entering_parallel == '\x01')) {
    *(int *)(local_248._0_8_ + 0x30) = *(int *)(local_248._0_8_ + 0x30) + -1;
    local_170 = (Alloc *)(*(size_t *)local_248._0_8_ * 8 + 1);
  }
  pAVar10 = local_170;
  local_248._0_8_ = (Alloc *)0x0;
  local_248._8_8_ = (void *)0x0;
  if ((local_248._16_8_ & 7) == 0 && (Alloc *)local_248._16_8_ != (Alloc *)0x0) {
    piVar2 = (int *)(local_248._16_8_ + 0x30);
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc((Alloc *)local_248._16_8_);
      operator_delete((void *)local_248._16_8_,0x48);
      uVar7 = local_248._0_8_;
      if ((local_248._0_8_ & 7) == 0 && (Alloc *)local_248._0_8_ != (Alloc *)0x0) {
        piVar2 = (int *)(local_248._0_8_ + 0x30);
        *piVar2 = *piVar2 + -1;
        if (*piVar2 == 0) {
          Alloc::~Alloc((Alloc *)local_248._0_8_);
          operator_delete((void *)uVar7,0x48);
        }
      }
    }
  }
  this = local_198;
  local_208.write_.shared_alloc_.alloc = (new_ents2old_ents->write_).shared_alloc_.alloc;
  if (((ulong)local_208.write_.shared_alloc_.alloc & 7) == 0 &&
      local_208.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_208.write_.shared_alloc_.alloc =
           (Alloc *)((local_208.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_208.write_.shared_alloc_.alloc)->use_count =
           (local_208.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  pvVar6 = (new_ents2old_ents->write_).shared_alloc_.direct_ptr;
  bVar14 = ((ulong)pAVar10 & 7) == 0;
  local_1c8.write_.shared_alloc_.alloc = pAVar10;
  if (bVar14 && pAVar10 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1c8.write_.shared_alloc_.alloc = (Alloc *)(pAVar10->size * 8 + 1);
    }
    else {
      pAVar10->use_count = pAVar10->use_count + 1;
    }
  }
  local_1c8.write_.shared_alloc_.direct_ptr = (void *)uVar8;
  local_208.write_.shared_alloc_.direct_ptr = pvVar6;
  unmap<int>((Omega_h *)local_248,&local_208,&local_1c8,1);
  pAVar9 = local_1c8.write_.shared_alloc_.alloc;
  if (((ulong)local_1c8.write_.shared_alloc_.alloc & 7) == 0 &&
      local_1c8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar2 = &(local_1c8.write_.shared_alloc_.alloc)->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(pAVar9);
      operator_delete(pAVar9,0x48);
    }
  }
  pAVar9 = local_208.write_.shared_alloc_.alloc;
  if (((ulong)local_208.write_.shared_alloc_.alloc & 7) == 0 &&
      local_208.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar2 = &(local_208.write_.shared_alloc_.alloc)->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_208.write_.shared_alloc_.alloc);
      operator_delete(pAVar9,0x48);
    }
  }
  local_1d8.shared_alloc_.alloc = (Alloc *)local_248._0_8_;
  if ((local_248._0_8_ & 7) == 0 && (Alloc *)local_248._0_8_ != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1d8.shared_alloc_.alloc = (Alloc *)(*(size_t *)local_248._0_8_ * 8 + 1);
    }
    else {
      *(int *)(local_248._0_8_ + 0x30) = *(int *)(local_248._0_8_ + 0x30) + 1;
    }
  }
  local_1d8.shared_alloc_.direct_ptr = (void *)local_248._8_8_;
  Read<int>::Read(&local_180,&local_1d8);
  local_1e8.shared_alloc_.alloc = (Alloc *)local_1a8;
  if (((ulong)local_1a8 & 7) == 0 && local_1a8 != (element_type *)0x0) {
    if (entering_parallel == '\x01') {
      local_1e8.shared_alloc_.alloc = (Alloc *)((long)local_1a8->library_ * 8 + 1);
    }
    else {
      ppvVar3 = &(local_1a8->host_srcs_).read_.write_.shared_alloc_.direct_ptr;
      *(int *)ppvVar3 = *(int *)ppvVar3 + 1;
    }
  }
  local_1e8.shared_alloc_.direct_ptr = local_1a0._M_pi;
  Read<int>::Read(&local_190,&local_1e8);
  Remotes::Remotes(this,(Read<int> *)&local_180,(LOs *)&local_190);
  if (((ulong)local_190.write_.shared_alloc_.alloc & 7) == 0 &&
      local_190.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar2 = &(local_190.write_.shared_alloc_.alloc)->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_190.write_.shared_alloc_.alloc);
      operator_delete(local_190.write_.shared_alloc_.alloc,0x48);
    }
  }
  pAVar9 = local_1e8.shared_alloc_.alloc;
  if (((ulong)local_1e8.shared_alloc_.alloc & 7) == 0 &&
      (element_type *)local_1e8.shared_alloc_.alloc != (element_type *)0x0) {
    ppvVar3 = &(((HostRead<int> *)&(local_1e8.shared_alloc_.alloc)->ptr)->read_).write_.
               shared_alloc_.direct_ptr;
    *(int *)ppvVar3 = *(int *)ppvVar3 + -1;
    if (*(int *)ppvVar3 == 0) {
      Alloc::~Alloc(local_1e8.shared_alloc_.alloc);
      operator_delete(pAVar9,0x48);
    }
  }
  if (((ulong)local_180.write_.shared_alloc_.alloc & 7) == 0 &&
      local_180.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar2 = &(local_180.write_.shared_alloc_.alloc)->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_180.write_.shared_alloc_.alloc);
      operator_delete(local_180.write_.shared_alloc_.alloc,0x48);
    }
  }
  pAVar9 = local_1d8.shared_alloc_.alloc;
  if (((ulong)local_1d8.shared_alloc_.alloc & 7) == 0 &&
      local_1d8.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar2 = &(local_1d8.shared_alloc_.alloc)->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_1d8.shared_alloc_.alloc);
      operator_delete(pAVar9,0x48);
    }
  }
  uVar8 = local_248._0_8_;
  if ((local_248._0_8_ & 7) == 0 && (Alloc *)local_248._0_8_ != (Alloc *)0x0) {
    piVar2 = (int *)(local_248._0_8_ + 0x30);
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc((Alloc *)local_248._0_8_);
      operator_delete((void *)uVar8,0x48);
    }
  }
  if (bVar14 && pAVar10 != (Alloc *)0x0) {
    piVar2 = &pAVar10->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(pAVar10);
      operator_delete(pAVar10,0x48);
    }
  }
  if (((ulong)local_1a8 & 7) == 0 && local_1a8 != (element_type *)0x0) {
    ppvVar3 = &(local_1a8->host_srcs_).read_.write_.shared_alloc_.direct_ptr;
    *(int *)ppvVar3 = *(int *)ppvVar3 + -1;
    if (*(int *)ppvVar3 == 0) {
      Alloc::~Alloc((Alloc *)local_1a8);
      operator_delete(local_1a8,0x48);
    }
  }
  uVar8 = local_228._0_8_;
  if ((local_228._0_8_ & 7) == 0 && (element_type *)local_228._0_8_ != (element_type *)0x0) {
    ppvVar3 = &(((HostRead<int> *)(local_228._0_8_ + 0x28))->read_).write_.shared_alloc_.direct_ptr;
    *(int *)ppvVar3 = *(int *)ppvVar3 + -1;
    if (*(int *)ppvVar3 == 0) {
      Alloc::~Alloc((Alloc *)local_228._0_8_);
      operator_delete((void *)uVar8,0x48);
    }
  }
  Dist::~Dist((Dist *)local_c0);
  Dist::~Dist((Dist *)local_150);
  ScopedTimer::~ScopedTimer(&local_249);
  return this;
}

Assistant:

Remotes unmap_owners(
    Mesh* old_mesh, Int ent_dim, LOs new_ents2old_ents, LOs old_ents2new_ents) {
  OMEGA_H_TIME_FUNCTION;
  auto old_copies2old_owners = old_mesh->ask_dist(ent_dim);
  auto old_owners2old_copies = old_copies2old_owners.invert();
  auto old_copies2new_owners = old_owners2old_copies.exch(old_ents2new_ents, 1);
  auto new_ents2new_owners = unmap(new_ents2old_ents, old_copies2new_owners, 1);
  auto old_own_ranks = old_mesh->ask_owners(ent_dim).ranks;
  auto new_own_ranks = unmap(new_ents2old_ents, old_own_ranks, 1);
  return Remotes(new_own_ranks, new_ents2new_owners);
}